

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O2

IntrinsicResult MiniScript::intrinsic_sum(Context *context,IntrinsicResult partialResult)

{
  Value *pVVar1;
  unsigned_long idx;
  anon_union_8_3_2f476f46_for_data aVar2;
  double dVar3;
  anon_union_8_3_2f476f46_for_data local_90;
  ValueList list;
  Value val;
  Value local_60;
  Value local_50;
  String local_40;
  ValueDictIterator kv;
  
  String::String(&local_40,"self");
  Context::GetVar((Context *)&val,(String *)partialResult.rs,(LocalOnlyMode)&local_40);
  String::~String(&local_40);
  if (val.type == Map) {
    Value::GetDict((ValueDict *)&list,&val);
    DictIterator<MiniScript::Value,_MiniScript::Value>::DictIterator
              (&kv,(DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)list._8_8_);
    local_90.number = 0.0;
    while (kv.entry != (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0) {
      Value::Value(&local_50,&(kv.entry)->value);
      aVar2 = local_50.data;
      if (local_50.type != Number) {
        aVar2.number = 0.0;
      }
      local_90.number = local_90.number + aVar2.number;
      Value::~Value(&local_50);
      DictIterator<MiniScript::Value,_MiniScript::Value>::Next(&kv);
    }
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::~Dictionary
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)&list);
  }
  else {
    local_90.number = 0.0;
    if (val.type == List) {
      Value::GetList((Value *)&list);
      if (list.ls == (ListStorage<MiniScript::Value> *)0x0) {
        idx = 0;
      }
      else {
        idx = ((list.ls)->super_SimpleVector<MiniScript::Value>).mQtyItems;
      }
      local_90.number = 0.0;
      while (0 < (long)idx) {
        idx = idx - 1;
        pVVar1 = List<MiniScript::Value>::operator[](&list,idx);
        if (pVVar1->type == Number) {
          dVar3 = (pVVar1->data).number;
        }
        else {
          dVar3 = 0.0;
        }
        local_90.number = local_90.number + dVar3;
      }
      List<MiniScript::Value>::release(&list);
    }
  }
  local_60.type = Number;
  local_60.noInvoke = false;
  local_60.localOnly = Off;
  local_60.data = local_90;
  IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_60,true);
  Value::~Value(&local_60);
  Value::~Value(&val);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_sum(Context *context, IntrinsicResult partialResult) {
		Value val = context->GetVar("self");
		double sum = 0;
		if (val.type == ValueType::List) {
			ValueList list = val.GetList();
			for (long i=list.Count()-1; i>=0; i--) {
				sum += list[i].DoubleValue();
			}
		} else if (val.type == ValueType::Map) {
			ValueDict map = val.GetDict();
			for (ValueDictIterator kv = map.GetIterator(); !kv.Done(); kv.Next()) {
				sum += kv.Value().DoubleValue();
			}
		}
		return IntrinsicResult(sum);
	}